

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

VisitStatus
Fixpp::impl::
visitDictionary<should_skip_unknown_tags::Spec::Dictionary,Fixpp::TypedParsingContext<void>,Fixpp::impl::MessageVisitor<should_skip_unknown_tags::Visitor,should_skip_unknown_tags::VisitRules>,should_skip_unknown_tags::VisitRules>
          (TypedParsingContext<void> *context,
          MessageVisitor<should_skip_unknown_tags::Visitor,_should_skip_unknown_tags::VisitRules>
          *visitor)

{
  bool bVar1;
  unsigned_long versionSize;
  char *version;
  MessageVisitor<should_skip_unknown_tags::Visitor,_should_skip_unknown_tags::VisitRules>
  *visitor_local;
  TypedParsingContext<void> *context_local;
  
  bVar1 = v44::Version::equals
                    ((context->super_ParsingContext).version.first,
                     (context->super_ParsingContext).version.second);
  if (bVar1) {
    bVar1 = meta::typelist::ops::
            Visitor<meta::typelist::TypeList<Fixpp::VersionnedMessage<Fixpp::v44::Version,_Fixpp::Chars<'W'>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<262U,_Fixpp::Type::String>,_Fixpp::TagT<55U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_meta::typelist::NullType>,_Fixpp::impl::DictionaryVisitor<Fixpp::VersionnedMessageRef<Fixpp::v44::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>,_meta::map::Map<>_>_>
            ::
            visit<Fixpp::TypedParsingContext<void>_&,_Fixpp::impl::MessageVisitor<should_skip_unknown_tags::Visitor,_should_skip_unknown_tags::VisitRules>_&>
                      (context,visitor);
    if (bVar1) {
      context_local._4_4_ = Ok;
    }
    else {
      context_local._4_4_ = NotFound;
    }
  }
  else {
    context_local._4_4_ = VersionMismatch;
  }
  return context_local._4_4_;
}

Assistant:

VisitStatus visitDictionary(Context& context, Visitor& visitor, Rules)
        {
            using Version = typename Dictionary::Version;
            using Header = typename Dictionary::Header::Ref;
            using Messages = typename Dictionary::Messages;

            using Overrides = typename Rules::Overrides;

            auto version = context.version.first;
            auto versionSize = context.version.second;

            using MessageVisitor = DictionaryVisitor<Header, Overrides>;

            if (Version::equals(version, versionSize))
            {
                using AllMessagesVisitor = meta::typelist::ops::Visitor<Messages, MessageVisitor>;
                if (AllMessagesVisitor::visit(context, visitor))
                    return VisitStatus::Ok;

                return VisitStatus::NotFound;
            }

            return VisitStatus::VersionMismatch;
        }